

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O2

void __thiscall
ScriptUtil_GetP2wpkhLockingScriptTest_Test::TestBody
          (ScriptUtil_GetP2wpkhLockingScriptTest_Test *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  pointer pubkey;
  initializer_list<ScriptUtil_PubkeyTestVector> __l;
  allocator_type local_21f;
  allocator local_21e;
  allocator local_21d;
  allocator local_21c;
  allocator local_21b;
  allocator local_21a;
  allocator local_219;
  string local_218;
  ByteData160 pubkey_hash;
  AssertionResult gtest_ar_1;
  Script local_1b0;
  vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_> test_vectors;
  string local_160;
  string local_140;
  Script actual;
  Pubkey local_d0;
  Script local_b8;
  Pubkey local_80;
  Script local_68;
  
  std::__cxx11::string::string
            ((string *)&local_1b0,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",&local_219);
  cfd::core::Pubkey::Pubkey((Pubkey *)&actual,(string *)&local_1b0);
  std::__cxx11::string::string
            ((string *)&local_218,"0014edaf2414751239b72b653ea004adc310a3522e37",&local_21a);
  cfd::core::Script::Script
            ((Script *)
             &actual.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_218);
  std::__cxx11::string::string
            ((string *)&pubkey_hash,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",&local_21b);
  cfd::core::Pubkey::Pubkey(&local_d0,(string *)&pubkey_hash);
  std::__cxx11::string::string
            ((string *)&gtest_ar_1,"001449a011f97ba520dab063f309bad59daeb30de101",&local_21c);
  cfd::core::Script::Script(&local_b8,(string *)&gtest_ar_1);
  std::__cxx11::string::string
            ((string *)&local_140,
             "04fe53c78e36b86aae8082484a4007b706d5678cabb92d178fc95020d4d8dc41ef44cfbb8dfa7a593c7910a5b6f94d079061a7766cbeed73e24ee4f654f1e51904"
             ,&local_21d);
  cfd::core::Pubkey::Pubkey(&local_80,&local_140);
  std::__cxx11::string::string
            ((string *)&local_160,"00148c1c7f335f5db8ae4e01615edb14844213ead725",&local_21e);
  cfd::core::Script::Script(&local_68,&local_160);
  __l._M_len = 3;
  __l._M_array = (iterator)&actual;
  std::vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>::vector
            (&test_vectors,__l,&local_21f);
  lVar3 = 0xa0;
  do {
    ScriptUtil_PubkeyTestVector::~ScriptUtil_PubkeyTestVector
              ((ScriptUtil_PubkeyTestVector *)((long)&actual._vptr_Script + lVar3));
    lVar3 = lVar3 + -0x50;
  } while (lVar3 != -0x50);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&pubkey_hash);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1b0);
  cfd::core::Script::Script(&actual);
  for (pubkey = test_vectors.
                super__Vector_base<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pubkey != test_vectors.
                super__Vector_base<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>
                ._M_impl.super__Vector_impl_data._M_finish; pubkey = pubkey + 1) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        cfd::core::ScriptUtil::CreateP2wpkhLockingScript(&local_1b0,&pubkey->input_pubkey);
        cfd::core::Script::operator=(&actual,&local_1b0);
        cfd::core::Script::~Script(&local_1b0);
      }
    }
    else {
      testing::Message::Message((Message *)&local_1b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x5f,
                 "Expected: (actual = ScriptUtil::CreateP2wpkhLockingScript(test_vector.input_pubkey)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1b0);
    }
    cfd::core::Script::GetHex_abi_cxx11_((string *)&local_1b0,&actual);
    pp_Var1 = local_1b0._vptr_Script;
    cfd::core::Script::GetHex_abi_cxx11_(&local_218,&pubkey->expect_locking_script);
    testing::internal::CmpHelperSTREQ
              ((internal *)&pubkey_hash,"actual.GetHex().c_str()",
               "test_vector.expect_locking_script.GetHex().c_str()",(char *)pp_Var1,
               local_218._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1b0);
    if ((char)pubkey_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_1b0);
      pcVar4 = "";
      if (pubkey_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        pcVar4 = *(char **)pubkey_hash.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x60,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1b0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&pubkey_hash.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
    cfd::core::HashUtil::Hash160(&pubkey_hash,&pubkey->input_pubkey);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        cfd::core::ScriptUtil::CreateP2wpkhLockingScript(&local_1b0,&pubkey_hash);
        cfd::core::Script::operator=(&actual,&local_1b0);
        cfd::core::Script::~Script(&local_1b0);
      }
    }
    else {
      testing::Message::Message((Message *)&local_1b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x62,
                 "Expected: (actual = ScriptUtil::CreateP2wpkhLockingScript(pubkey_hash)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1b0);
    }
    cfd::core::Script::GetHex_abi_cxx11_((string *)&local_1b0,&actual);
    pp_Var1 = local_1b0._vptr_Script;
    cfd::core::Script::GetHex_abi_cxx11_(&local_218,&pubkey->expect_locking_script);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_1,"actual.GetHex().c_str()",
               "test_vector.expect_locking_script.GetHex().c_str()",(char *)pp_Var1,
               local_218._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1b0);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_1b0);
      pcVar4 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,99,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1b0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_hash);
  }
  cfd::core::Script::~Script(&actual);
  std::vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>::~vector
            (&test_vectors);
  return;
}

Assistant:

TEST(ScriptUtil, GetP2wpkhLockingScriptTest) {
  const std::vector<ScriptUtil_PubkeyTestVector> test_vectors = {
    {
      Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
      Script("0014edaf2414751239b72b653ea004adc310a3522e37")
    },
    {
      Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
      Script("001449a011f97ba520dab063f309bad59daeb30de101")
    },
    {
      Pubkey("04fe53c78e36b86aae8082484a4007b706d5678cabb92d178fc95020d4d8dc41ef44cfbb8dfa7a593c7910a5b6f94d079061a7766cbeed73e24ee4f654f1e51904"),
      Script("00148c1c7f335f5db8ae4e01615edb14844213ead725")
    },
  };

  Script actual;
  for (const ScriptUtil_PubkeyTestVector& test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2wpkhLockingScript(test_vector.input_pubkey)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
    ByteData160 pubkey_hash = HashUtil::Hash160(test_vector.input_pubkey);
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2wpkhLockingScript(pubkey_hash)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
  }
}